

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O2

idx_t duckdb::Blob::GetBlobSize(string_t str,CastParameters *parameters)

{
  bool bVar1;
  InternalException *this;
  CastParameters *in_R8;
  string_t str_00;
  allocator local_41;
  idx_t str_len;
  string local_38;
  
  str_00.value._0_8_ = str.value._8_8_;
  str_00.value.pointer.ptr = (char *)&str_len;
  bVar1 = TryGetBlobSize(str.value._0_8_,str_00,(idx_t *)parameters,in_R8);
  if (bVar1) {
    return str_len;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Blob::TryGetBlobSize failed but no exception was thrown!?",
             &local_41);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t Blob::GetBlobSize(string_t str, CastParameters &parameters) {
	idx_t str_len;
	auto result = Blob::TryGetBlobSize(str, str_len, parameters);
	if (!result) {
		throw InternalException("Blob::TryGetBlobSize failed but no exception was thrown!?");
	}
	return str_len;
}